

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_image_writer.cpp
# Opt level: O3

ssize_t __thiscall PgmImageWriter::write(PgmImageWriter *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  uint8_t *puVar7;
  undefined4 extraout_var_00;
  undefined4 in_register_00000034;
  Stream *this_00;
  string local_48;
  ssize_t sVar6;
  
  this_00 = (Stream *)CONCAT44(in_register_00000034,__fd);
  uVar1 = dpfb::Image::getWidth((Image *)__buf);
  uVar2 = dpfb::Image::getHeight((Image *)__buf);
  dpfb::str::format_abi_cxx11_(&local_48,"P5\n%i %i\n255\n",(ulong)uVar1,(ulong)uVar2);
  dpfb::streams::Stream::writeStr(this_00,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  iVar3 = dpfb::Image::getHeight((Image *)__buf);
  sVar6 = CONCAT44(extraout_var,iVar3);
  if (0 < iVar3) {
    iVar3 = 0;
    do {
      puVar7 = dpfb::Image::getData((Image *)__buf);
      iVar4 = dpfb::Image::getPitch((Image *)__buf);
      iVar5 = dpfb::Image::getWidth((Image *)__buf);
      (*this_00->_vptr_Stream[3])(this_00,puVar7 + iVar4 * iVar3,(long)iVar5);
      iVar3 = iVar3 + 1;
      iVar4 = dpfb::Image::getHeight((Image *)__buf);
      sVar6 = CONCAT44(extraout_var_00,iVar4);
    } while (iVar3 < iVar4);
  }
  return sVar6;
}

Assistant:

void PgmImageWriter::write(
    dpfb::streams::Stream& stream, const dpfb::Image& image) const
{
    stream.writeStr(
        dpfb::str::format(
            "P5\n%i %i\n255\n",
            image.getWidth(), image.getHeight()));
    for (int y = 0; y < image.getHeight(); ++y)
        stream.writeBuffer(
            image.getData() + y * image.getPitch(), image.getWidth());
}